

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

uint16_t icu_63::getAlgName(AlgorithmicRange *range,uint32_t code,UCharNameChoice nameChoice,
                           char *buffer,uint16_t bufferLength)

{
  char cVar1;
  byte bVar2;
  uint16_t uVar3;
  ulong uVar4;
  long lVar5;
  char *s;
  short sVar6;
  ulong uVar7;
  uint uVar8;
  char cVar9;
  uint16_t indexes [8];
  uint16_t local_18 [8];
  
  if ((nameChoice & ~U_EXTENDED_CHAR_NAME) == U_UNICODE_CHAR_NAME) {
    uVar4 = (ulong)code;
    if (range->type == '\x01') {
      bVar2 = range->variant;
      sVar6 = 0;
      for (s = (char *)((long)&range[1].start + (ulong)bVar2 * 2 + 1); s[-1] != '\0'; s = s + 1) {
        if (bufferLength == 0) {
          bufferLength = 0;
        }
        else {
          *buffer = s[-1];
          buffer = buffer + 1;
          bufferLength = bufferLength - 1;
        }
        sVar6 = sVar6 + 1;
      }
      uVar3 = writeFactorSuffix((uint16_t *)(range + 1),(ushort)bVar2,s,code - range->start,local_18
                                ,(char **)0x0,(char **)0x0,buffer,bufferLength);
      return sVar6 + uVar3;
    }
    if (range->type == '\0') {
      for (lVar5 = 0; cVar1 = *(char *)((long)&range[1].start + lVar5), cVar1 != '\0';
          lVar5 = lVar5 + 1) {
        if (bufferLength == 0) {
          bufferLength = 0;
        }
        else {
          *buffer = cVar1;
          buffer = buffer + 1;
          bufferLength = bufferLength - 1;
        }
      }
      bVar2 = range->variant;
      uVar7 = (ulong)bVar2;
      if (bVar2 < bufferLength) {
        buffer[uVar7] = '\0';
      }
      while (uVar7 = uVar7 - 1, uVar7 != 0xffffffffffffffff) {
        if (uVar7 < bufferLength) {
          uVar8 = (uint)uVar4 & 0xf;
          cVar1 = (char)uVar8;
          cVar9 = cVar1 + '7';
          if (uVar8 < 10) {
            cVar9 = cVar1 + '0';
          }
          buffer[uVar7] = cVar9;
        }
        uVar4 = uVar4 >> 4;
      }
      return (ushort)bVar2 + (short)lVar5;
    }
  }
  if (bufferLength != 0) {
    *buffer = '\0';
  }
  return 0;
}

Assistant:

static uint16_t
getAlgName(AlgorithmicRange *range, uint32_t code, UCharNameChoice nameChoice,
        char *buffer, uint16_t bufferLength) {
    uint16_t bufferPos=0;

    /* Only the normative character name can be algorithmic. */
    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        /* zero-terminate */
        if(bufferLength>0) {
            *buffer=0;
        }
        return 0;
    }

    switch(range->type) {
    case 0: {
        /* name = prefix hex-digits */
        const char *s=(const char *)(range+1);
        char c;

        uint16_t i, count;

        /* copy prefix */
        while((c=*s++)!=0) {
            WRITE_CHAR(buffer, bufferLength, bufferPos, c);
        }

        /* write hexadecimal code point value */
        count=range->variant;

        /* zero-terminate */
        if(count<bufferLength) {
            buffer[count]=0;
        }

        for(i=count; i>0;) {
            if(--i<bufferLength) {
                c=(char)(code&0xf);
                if(c<10) {
                    c+='0';
                } else {
                    c+='A'-10;
                }
                buffer[i]=c;
            }
            code>>=4;
        }

        bufferPos+=count;
        break;
    }
    case 1: {
        /* name = prefix factorized-elements */
        uint16_t indexes[8];
        const uint16_t *factors=(const uint16_t *)(range+1);
        uint16_t count=range->variant;
        const char *s=(const char *)(factors+count);
        char c;

        /* copy prefix */
        while((c=*s++)!=0) {
            WRITE_CHAR(buffer, bufferLength, bufferPos, c);
        }

        bufferPos+=writeFactorSuffix(factors, count,
                                     s, code-range->start, indexes, NULL, NULL, buffer, bufferLength);
        break;
    }
    default:
        /* undefined type */
        /* zero-terminate */
        if(bufferLength>0) {
            *buffer=0;
        }
        break;
    }

    return bufferPos;
}